

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::
SmallSetBase<wasm::Name,_2UL,_wasm::OrderedFixedStorage<wasm::Name,_2UL>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
::insert(SmallSetBase<wasm::Name,_2UL,_wasm::OrderedFixedStorage<wasm::Name,_2UL>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
         *this,Name *x)

{
  bool bVar1;
  InsertResult IVar2;
  iterator __first;
  iterator pvVar3;
  Name *x_local;
  SmallSetBase<wasm::Name,_2UL,_wasm::OrderedFixedStorage<wasm::Name,_2UL>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
  *this_local;
  
  bVar1 = usingFixed(this);
  if (bVar1) {
    IVar2 = OrderedFixedStorage<wasm::Name,_2UL>::insert(&this->fixed,x);
    if (IVar2 == CouldNotInsert) {
      if ((this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.used != 2) {
        __assert_fail("fixed.used == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa7,
                      "void wasm::SmallSetBase<wasm::Name, 2, wasm::OrderedFixedStorage<wasm::Name, 2>, std::set<wasm::Name>>::insert(const T &) [T = wasm::Name, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::Name, 2>, FlexibleSet = std::set<wasm::Name>]"
                     );
      }
      bVar1 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::empty
                        (&this->flexible);
      if (!bVar1) {
        __assert_fail("flexible.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa8,
                      "void wasm::SmallSetBase<wasm::Name, 2, wasm::OrderedFixedStorage<wasm::Name, 2>, std::set<wasm::Name>>::insert(const T &) [T = wasm::Name, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::Name, 2>, FlexibleSet = std::set<wasm::Name>]"
                     );
      }
      __first = std::array<wasm::Name,_2UL>::begin
                          (&(this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.storage);
      pvVar3 = std::array<wasm::Name,_2UL>::begin
                         (&(this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.storage);
      std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::insert<wasm::Name*>
                ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)&this->flexible
                 ,__first,pvVar3 + (this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.used);
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                (&this->flexible,x);
      bVar1 = usingFixed(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!usingFixed()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xac,
                      "void wasm::SmallSetBase<wasm::Name, 2, wasm::OrderedFixedStorage<wasm::Name, 2>, std::set<wasm::Name>>::insert(const T &) [T = wasm::Name, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::Name, 2>, FlexibleSet = std::set<wasm::Name>]"
                     );
      }
      (this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.used = 0;
    }
  }
  else {
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->flexible,x);
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }